

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::engine_ready(session_base_t *this)

{
  own_t *poVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  own_t *in_RDI;
  char *errstr;
  int rc;
  bool conflates [2];
  int hwms [2];
  bool conflate;
  pipe_t *pipes [2];
  object_t *parents [2];
  endpoint_uri_pair_t *in_stack_fffffffffffffed8;
  pipe_t *in_stack_fffffffffffffee0;
  pipe_t *this_00;
  undefined4 in_stack_fffffffffffffef8;
  int iVar6;
  endpoint_uri_pair_t *this_01;
  int local_f4;
  undefined1 local_e8 [79];
  undefined1 in_stack_ffffffffffffff67;
  pipe_t *in_stack_ffffffffffffff68;
  own_t *in_stack_ffffffffffffff70;
  object_t *in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  uint64_t local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_20 [2];
  
  if ((in_RDI[1].options.affinity == 0) && (bVar2 = own_t::is_terminating(in_RDI), !bVar2)) {
    poVar1 = in_RDI + 1;
    local_20[1]._0_1_ = (_Alloc_hider)(poVar1->options).routing_id[0x47];
    local_20[1]._1_1_ = (poVar1->options).routing_id[0x48];
    local_20[1]._2_1_ = (poVar1->options).routing_id[0x49];
    local_20[1]._3_1_ = (poVar1->options).routing_id[0x4a];
    local_20[1]._4_1_ = (poVar1->options).routing_id[0x4b];
    local_20[1]._5_1_ = (poVar1->options).routing_id[0x4c];
    local_20[1]._6_1_ = (poVar1->options).routing_id[0x4d];
    local_20[1]._7_1_ = (poVar1->options).routing_id[0x4e];
    memset(&local_28,0,0x10);
    bVar2 = get_effective_conflate_option(&in_RDI->options);
    if (bVar2) {
      local_f4 = -1;
    }
    else {
      local_f4 = (in_RDI->options).rcvhwm;
    }
    this_01 = (endpoint_uri_pair_t *)&stack0xffffffffffffffd0;
    if (bVar2) {
      iVar6 = -1;
    }
    else {
      iVar6 = (in_RDI->options).sndhwm;
    }
    iVar3 = pipepair((object_t **)CONCAT17(bVar2,in_stack_ffffffffffffffd0),
                     (pipe_t **)
                     CONCAT44(local_f4,CONCAT13(bVar2,CONCAT12(bVar2,in_stack_ffffffffffffffc8))),
                     (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x1b2);
      fflush(_stderr);
      zmq_abort((char *)0x235fb8);
    }
    pipe_t::set_event_sink(in_stack_fffffffffffffee0,(i_pipe_events *)in_stack_fffffffffffffed8);
    if (in_RDI[1].options.affinity != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_pipe",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0x1b8);
      fflush(_stderr);
      zmq_abort((char *)0x236034);
    }
    in_RDI[1].options.affinity = local_28;
    (**(code **)(**(long **)(in_RDI[1].options.routing_id + 0x3f) + 0x40))();
    endpoint_uri_pair_t::endpoint_uri_pair_t
              (this_01,(endpoint_uri_pair_t *)CONCAT44(iVar6,in_stack_fffffffffffffef8));
    pipe_t::set_endpoint_pair(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)in_stack_fffffffffffffee0);
    (**(code **)(**(long **)(in_RDI[1].options.routing_id + 0x3f) + 0x40))();
    this_00 = (pipe_t *)local_e8;
    endpoint_uri_pair_t::endpoint_uri_pair_t
              (this_01,(endpoint_uri_pair_t *)CONCAT44(iVar6,in_stack_fffffffffffffef8));
    pipe_t::set_endpoint_pair(this_00,(endpoint_uri_pair_t *)local_20[0]._0_8_);
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)this_00);
    object_t::send_bind(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  }
  return;
}

Assistant:

void zmq::session_base_t::engine_ready ()
{
    //  Create the pipe if it does not exist yet.
    if (!_pipe && !is_terminating ()) {
        object_t *parents[2] = {this, _socket};
        pipe_t *pipes[2] = {NULL, NULL};

        const bool conflate = get_effective_conflate_option (options);

        int hwms[2] = {conflate ? -1 : options.rcvhwm,
                       conflate ? -1 : options.sndhwm};
        bool conflates[2] = {conflate, conflate};
        const int rc = pipepair (parents, pipes, hwms, conflates);
        errno_assert (rc == 0);

        //  Plug the local end of the pipe.
        pipes[0]->set_event_sink (this);

        //  Remember the local end of the pipe.
        zmq_assert (!_pipe);
        _pipe = pipes[0];

        //  The endpoints strings are not set on bind, set them here so that
        //  events can use them.
        pipes[0]->set_endpoint_pair (_engine->get_endpoint ());
        pipes[1]->set_endpoint_pair (_engine->get_endpoint ());

        //  Ask socket to plug into the remote end of the pipe.
        send_bind (_socket, pipes[1]);
    }
}